

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingBuffer.h
# Opt level: O0

void __thiscall
RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
::reset_and_resize(RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
                   *this,size_t n)

{
  DataBlock **ppDVar1;
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  *in_RSI;
  size_type in_RDI;
  new_allocator<Deque<int,_std::allocator<int>_>::DataBlock_*> *unaff_retaddr;
  size_type __n;
  
  __n = in_RDI;
  reset(in_RSI);
  ppDVar1 = __gnu_cxx::new_allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>::allocate
                      (unaff_retaddr,__n,in_RSI);
  *(DataBlock ***)(in_RDI + 8) = ppDVar1;
  *(DataBlock ***)(in_RDI + 0x10) = ppDVar1;
  *(DataBlock ***)(in_RDI + 0x18) = ppDVar1;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
    **)(in_RDI + 0x28) = in_RSI;
  return;
}

Assistant:

void reset_and_resize(std::size_t n) {
        reset();
        end_ = begin_ = arr_ = allocator_.allocate(n);
        size_ = 0;
        allocSize_ = n;
    }